

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::RendererTests_renderHoveredButtons_Test::
~RendererTests_renderHoveredButtons_Test(RendererTests_renderHoveredButtons_Test *this)

{
  RendererTests::~RendererTests(&this->super_RendererTests);
  operator_delete(this,0x9d0);
  return;
}

Assistant:

TEST_F(RendererTests, renderHoveredButtons) {
    EXPECT_CALL(*graphicsSystemMock,
        renderTextureInFullWindow(backgroundTextureId));
    EXPECT_CALL(contextMock, getNewGameButton()).WillOnce(ReturnRef(buttonMock));
    EXPECT_CALL(buttonMock, isHovered()).WillOnce(Return(true));
    EXPECT_CALL(*graphicsSystemMock, setTextureAlpha(newGameId, noAlpha));
    EXPECT_CALL(contextMock, getUndoButton()).WillOnce(ReturnRef(buttonMock));
    EXPECT_CALL(buttonMock, isHovered()).WillOnce(Return(true));
    EXPECT_CALL(*graphicsSystemMock, setTextureAlpha(undoId, noAlpha));
    expectRenderButtons();
    EXPECT_CALL(contextMock, getSolitaire()).WillOnce(ReturnRef(solitaireMock));
    EXPECT_CALL(solitaireMock, isGameFinished()).WillOnce(Return(true));
    EXPECT_CALL(*graphicsSystemMock, renderTextureInFullWindow(winId));
    EXPECT_CALL(*graphicsSystemMock, renderFrame());

    Renderer {contextMock, graphicsSystemMock.make_unique(), assetsPath}.render();
}